

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  Curl_easy *data;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *local_460;
  char unknown [32];
  char ssl_buf [1024];
  
  if (userp == (void *)0x0) {
    return;
  }
  data = *userp;
  if (data == (Curl_easy *)0x0) {
    return;
  }
  if ((data->set).fdebug == (curl_debug_callback)0x0) {
    return;
  }
  if (1 < (uint)direction) {
    return;
  }
  switch(ssl_ver) {
  case 0x300:
    local_460 = "SSLv3";
    break;
  case 0x301:
    local_460 = "TLSv1.0";
    break;
  case 0x302:
    local_460 = "TLSv1.1";
    break;
  case 0x303:
    local_460 = "TLSv1.2";
    break;
  case 0x304:
    local_460 = "TLSv1.3";
    break;
  default:
    if (ssl_ver == 0) goto LAB_003ba28a;
    if (ssl_ver == 2) {
      local_460 = "SSLv2";
    }
    else {
      local_460 = unknown;
      curl_msnprintf(local_460,0x20,"(%x)",(ulong)(uint)ssl_ver);
    }
  }
  if (content_type == 0 || (ssl_ver & 0xffffff00U) != 0x300) {
    pcVar3 = "";
  }
  else {
    uVar1 = content_type;
    if ((len != 0 && buf != (void *)0x0) && content_type == 0x101) {
      uVar1 = (uint)*buf;
    }
    switch(uVar1) {
    case 0x14:
      pcVar3 = "TLS change cipher";
      break;
    case 0x15:
      pcVar3 = "TLS alert";
      break;
    case 0x16:
      pcVar3 = "TLS handshake";
      break;
    case 0x17:
      pcVar3 = "TLS app data";
      break;
    default:
      if (uVar1 == 0x100) {
        pcVar3 = "TLS header";
      }
      else {
        pcVar3 = "TLS Unknown";
      }
    }
  }
  if (content_type == 0x101) {
    uVar5 = 0;
    pcVar4 = "[no content]";
  }
  else if (content_type == 0x15) {
    uVar1 = (int)*(char *)((long)buf + 1) + *buf * 0x100;
    uVar5 = (ulong)uVar1;
    pcVar4 = SSL_alert_desc_string_long(uVar1);
  }
  else if (content_type == 0x14) {
    pcVar4 = "Change cipher spec";
    uVar5 = (ulong)(uint)(int)*buf;
  }
  else if ((ssl_ver & 0xffffff00U) == 0x300) {
    uVar5 = (ulong)(uint)(int)*buf & 0xff;
    switch(uVar5) {
    case 0:
      pcVar4 = "Hello request";
      break;
    case 1:
      uVar5 = 1;
      pcVar4 = "Client hello";
      break;
    case 2:
      uVar5 = 2;
      pcVar4 = "Server hello";
      break;
    case 3:
    case 6:
    case 7:
    case 9:
    case 10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x17:
      goto switchD_003ba1cf_caseD_3;
    case 4:
      uVar5 = 4;
      pcVar4 = "Newsession Ticket";
      break;
    case 5:
      uVar5 = 5;
      pcVar4 = "End of early data";
      break;
    case 8:
      uVar5 = 8;
      pcVar4 = "Encrypted Extensions";
      break;
    case 0xb:
      uVar5 = 0xb;
      pcVar4 = "Certificate";
      break;
    case 0xc:
      uVar5 = 0xc;
      pcVar4 = "Server key exchange";
      break;
    case 0xd:
      uVar5 = 0xd;
      pcVar4 = "Request CERT";
      break;
    case 0xe:
      uVar5 = 0xe;
      pcVar4 = "Server finished";
      break;
    case 0xf:
      uVar5 = 0xf;
      pcVar4 = "CERT verify";
      break;
    case 0x10:
      uVar5 = 0x10;
      pcVar4 = "Client key exchange";
      break;
    case 0x14:
      uVar5 = 0x14;
      pcVar4 = "Finished";
      break;
    case 0x16:
      uVar5 = 0x16;
      pcVar4 = "Certificate Status";
      break;
    case 0x18:
      uVar5 = 0x18;
      pcVar4 = "Key update";
      break;
    default:
      if ((int)uVar5 != 0x43) goto switchD_003ba1cf_caseD_3;
      pcVar4 = "Next protocol";
      uVar5 = 0x43;
    }
  }
  else {
switchD_003ba1cf_caseD_3:
    pcVar4 = "Unknown";
    uVar5 = (ulong)(uint)(int)*buf;
  }
  pcVar2 = "OUT";
  if (direction == 0) {
    pcVar2 = "IN";
  }
  uVar1 = curl_msnprintf(ssl_buf,0x400,"%s (%s), %s, %s (%d):\n",local_460,pcVar2,pcVar3,pcVar4,
                         uVar5);
  if (uVar1 < 0x400) {
    Curl_debug(data,CURLINFO_TEXT,ssl_buf,(ulong)uVar1);
  }
LAB_003ba28a:
  Curl_debug(data,(direction == 1) + CURLINFO_SSL_DATA_IN,(char *)buf,len);
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  char unknown[32];
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    snprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  if(ssl_ver) {
    const char *msg_name, *tls_rt_name;
    char ssl_buf[1024];
    int msg_type, txt_len;

    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type, buf, len);
    else
      tls_rt_name = "";

#ifdef SSL3_RT_INNER_CONTENT_TYPE
    if(content_type == SSL3_RT_INNER_CONTENT_TYPE) {
      msg_type = 0;
      msg_name = "[no content]";
    }
    else
#endif
    if(content_type == SSL3_RT_CHANGE_CIPHER_SPEC) {
      msg_type = *(char *)buf;
      msg_name = "Change cipher spec";
    }
    else if(content_type == SSL3_RT_ALERT) {
      msg_type = (((char *)buf)[0] << 8) + ((char *)buf)[1];
      msg_name = SSL_alert_desc_string_long(msg_type);
    }
    else {
      msg_type = *(char *)buf;
      msg_name = ssl_msg_type(ssl_ver, msg_type);
    }

    txt_len = snprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                       verstr, direction?"OUT":"IN",
                       tls_rt_name, msg_name, msg_type);
    if(0 <= txt_len && (unsigned)txt_len < sizeof(ssl_buf)) {
      Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len);
    }
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len);
  (void) ssl;
}